

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  int code;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  void *__buf_00;
  Fault f;
  Fault local_20;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  do {
    if (__buf == (void *)0x0) {
      return in_RAX;
    }
    while( true ) {
      in_RAX = ::write(this->fd,__buf_00,(size_t)__buf);
      if (-1 < in_RAX) break;
      code = _::Debug::getOsErrorNumber(false);
      if (code != -1) {
        if (code != 0) {
          _::Debug::Fault::Fault<int,int&>
                    (&local_20,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                     ,0x16e,code,"n = miniposix::write(fd, pos, size)","fd",&this->fd);
          _::Debug::Fault::fatal(&local_20);
        }
        goto LAB_0017af2b;
      }
    }
    if (in_RAX == 0) {
LAB_0017af2b:
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x16f,FAILED,"n > 0","\"write() returned zero.\"",
                 (char (*) [23])"write() returned zero.");
      _::Debug::Fault::fatal(&local_20);
    }
    __buf_00 = (void *)((long)__buf_00 + in_RAX);
    __buf = (void *)((long)__buf - in_RAX);
  } while( true );
}

Assistant:

void FdOutputStream::write(const void* buffer, size_t size) {
  const char* pos = reinterpret_cast<const char*>(buffer);

  while (size > 0) {
    miniposix::ssize_t n;
    KJ_SYSCALL(n = miniposix::write(fd, pos, size), fd);
    KJ_ASSERT(n > 0, "write() returned zero.");
    pos += n;
    size -= n;
  }
}